

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint uivector_resize(uivector *p,size_t size)

{
  ulong uVar1;
  uint *puVar2;
  ulong __size;
  
  uVar1 = size * 4;
  if (p->allocsize < uVar1) {
    __size = size * 0xc >> 1;
    if (p->allocsize * 2 < uVar1) {
      __size = uVar1;
    }
    puVar2 = (uint *)realloc(p->data,__size);
    if (puVar2 == (uint *)0x0) {
      return 0;
    }
    p->allocsize = __size;
    p->data = puVar2;
  }
  p->size = size;
  return 1;
}

Assistant:

static unsigned uivector_resize(uivector* p, size_t size) {
  if(!uivector_reserve(p, size * sizeof(unsigned))) return 0;
  p->size = size;
  return 1; /*success*/
}